

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_lifetime.h
# Opt level: O3

void __thiscall
validation_layer::HandleLifetimeValidation::addHandle
          (HandleLifetimeValidation *this,ze_module_build_log_handle_t handle)

{
  ze_module_build_log_handle_t local_18;
  void *local_10;
  
  local_10 = (void *)0x0;
  local_18 = handle;
  std::
  _Hashtable<_ze_module_build_log_handle_t*,std::pair<_ze_module_build_log_handle_t*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>,std::allocator<std::pair<_ze_module_build_log_handle_t*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>>,std::__detail::_Select1st,std::equal_to<_ze_module_build_log_handle_t*>,std::hash<_ze_module_build_log_handle_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<_ze_module_build_log_handle_t*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>>
            (&this->moduleBuildLogHandleStateMap,&local_18);
  if (local_10 != (void *)0x0) {
    operator_delete(local_10,1);
  }
  return;
}

Assistant:

void addHandle(ze_module_build_log_handle_t handle) {
    moduleBuildLogHandleStateMap.insert({handle, nullptr});
  }